

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O0

uint64_t un_ft_offset(stagewise_poly *poly,uint64_t idx)

{
  uint32_t uVar1;
  size_t sVar2;
  uint64_t in_RSI;
  undefined8 *in_RDI;
  parameters *in_stack_ffffffffffffffd8;
  ulong local_18;
  uint64_t local_8;
  
  local_18 = in_RSI;
  local_8 = in_RSI;
  if (in_RDI[0xd10] != 0) {
    for (; local_18 < (ulong)in_RDI[0xd10]; local_18 = (sVar2 << ((byte)uVar1 & 0x3f)) + local_18) {
      sVar2 = vw::length((vw *)*in_RDI);
      uVar1 = parameters::stride_shift(in_stack_ffffffffffffffd8);
    }
    local_8 = local_18 - in_RDI[0xd10];
  }
  return local_8;
}

Assistant:

inline uint64_t un_ft_offset(const stagewise_poly &poly, uint64_t idx)
{
  assert(!poly.original_ec || poly.synth_ec.ft_offset == poly.original_ec->ft_offset);
  if (poly.synth_ec.ft_offset == 0)
    return idx;
  else
  {
    while (idx < poly.synth_ec.ft_offset)
    {
      idx += poly.all->length() << poly.all->weights.stride_shift();
    }
    return idx - poly.synth_ec.ft_offset;
  }
}